

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.cpp
# Opt level: O0

void * nodecpp::VirtualMemory::AllocateAddressSpace(size_t size)

{
  int obj_1;
  void *obj;
  int *piVar1;
  char *obj_2;
  bad_alloc *this;
  ModuleID local_28;
  int local_1c;
  void *pvStack_18;
  int e;
  void *ptr;
  size_t size_local;
  
  ptr = (void *)size;
  pvStack_18 = mmap((void *)0x0,size,0,0x22,-1,0);
  if (pvStack_18 == (void *)0xffffffffffffffff) {
    piVar1 = __errno_location();
    local_1c = *piVar1;
    log::ModuleID::ModuleID(&local_28,"foundation");
    obj = ptr;
    obj_1 = local_1c;
    obj_2 = strerror(local_1c);
    log::default_log::error<char_const*,unsigned_long,int,char*>
              (&local_28,"mmap error at AllocateAddressSpace({}), error = {} ({})",
               (unsigned_long)obj,obj_1,obj_2);
    this = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(this,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return pvStack_18;
}

Assistant:

void* VirtualMemory::AllocateAddressSpace(size_t size)
{
    void * ptr = mmap((void*)0, size, PROT_NONE, MAP_PRIVATE|MAP_ANON, -1, 0);
	if (ptr == (void*)(-1))
	{
		int e = errno;
		nodecpp::log::default_log::error( nodecpp::log::ModuleID(nodecpp::foundation_module_id), "mmap error at AllocateAddressSpace({}), error = {} ({})", size, e, strerror(e) );
		throw std::bad_alloc();
	}
 //   msync(ptr, size, MS_SYNC|MS_INVALIDATE);
    return ptr;
}